

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_flags_encoder.c
# Opt level: O0

lzma_ret lzma_filter_flags_encode(lzma_filter *filter,uint8_t *out,size_t *out_pos,size_t out_size)

{
  lzma_ret ret__3;
  lzma_ret ret__2;
  lzma_ret ret__1;
  lzma_ret ret_;
  uint32_t props_size;
  size_t out_size_local;
  size_t *out_pos_local;
  uint8_t *out_local;
  lzma_filter *filter_local;
  
  if (filter->id < 0x4000000000000000) {
    _ret_ = out_size;
    out_size_local = (size_t)out_pos;
    out_pos_local = (size_t *)out;
    out_local = (uint8_t *)filter;
    filter_local._4_4_ = lzma_vli_encode(filter->id,(size_t *)0x0,out,out_pos,out_size);
    if (((filter_local._4_4_ == LZMA_OK) &&
        (filter_local._4_4_ = lzma_properties_size(&ret__1,(lzma_filter *)out_local),
        filter_local._4_4_ == LZMA_OK)) &&
       (filter_local._4_4_ =
             lzma_vli_encode((ulong)ret__1,(size_t *)0x0,(uint8_t *)out_pos_local,
                             (size_t *)out_size_local,_ret_), filter_local._4_4_ == LZMA_OK)) {
      if (_ret_ - *(long *)out_size_local < (ulong)ret__1) {
        filter_local._4_4_ = LZMA_PROG_ERROR;
      }
      else {
        filter_local._4_4_ =
             lzma_properties_encode
                       ((lzma_filter *)out_local,
                        (uint8_t *)((long)out_pos_local + *(long *)out_size_local));
        if (filter_local._4_4_ == LZMA_OK) {
          *(ulong *)out_size_local = (ulong)ret__1 + *(long *)out_size_local;
          filter_local._4_4_ = LZMA_OK;
        }
      }
    }
  }
  else {
    filter_local._4_4_ = LZMA_PROG_ERROR;
  }
  return filter_local._4_4_;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_filter_flags_encode(const lzma_filter *filter,
		uint8_t *out, size_t *out_pos, size_t out_size)
{
	uint32_t props_size;

	// Filter ID
	if (filter->id >= LZMA_FILTER_RESERVED_START)
		return LZMA_PROG_ERROR;

	return_if_error(lzma_vli_encode(filter->id, NULL,
			out, out_pos, out_size));

	// Size of Properties
	return_if_error(lzma_properties_size(&props_size, filter));
	return_if_error(lzma_vli_encode(props_size, NULL,
			out, out_pos, out_size));

	// Filter Properties
	if (out_size - *out_pos < props_size)
		return LZMA_PROG_ERROR;

	return_if_error(lzma_properties_encode(filter, out + *out_pos));

	*out_pos += props_size;

	return LZMA_OK;
}